

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O0

void __thiscall
dg::LLVMDependenceGraph::handleInstruction
          (LLVMDependenceGraph *this,Value *val,LLVMNode *node,LLVMNode *prevNode)

{
  _Base_ptr p_Var1;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  function_ref<void_(const_llvm::Value_*)> Func;
  function_ref<void_(const_llvm::Value_*)> Func_00;
  function_ref<void_(const_llvm::Value_*)> Func_01;
  StringRef LHS;
  StringRef LHS_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  ret_type pIVar6;
  Value *pVVar7;
  Value *val_00;
  long in_RCX;
  LLVMNode *in_RDI;
  undefined1 auVar8 [16];
  pair<std::_Rb_tree_const_iterator<dg::LLVMNode_*>,_bool> pVar9;
  Value *op_1;
  Value *op;
  Instruction *Inst;
  LLVMNode *noret;
  LLVMDependenceGraph *subg_3;
  Function **function_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range3_1;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> possibleFunctions_1;
  LLVMDependenceGraph *subg_2;
  LLVMDependenceGraph *subg_1;
  LLVMDependenceGraph *subg;
  Function **function;
  iterator __end6;
  iterator __begin6;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range6;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> possibleFunctions;
  Function *F;
  LLVMPointer *ptr;
  const_iterator __end3;
  const_iterator __begin3;
  LLVMPointsToSet *__range3;
  LLVMPointsToSet pts;
  Function *func;
  Value *strippedValue;
  CallInst *CInst;
  LLVMNode *in_stack_fffffffffffffdf8;
  uint i;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_stack_fffffffffffffe00;
  CallBase *in_stack_fffffffffffffe08;
  undefined5 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe15;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 uVar11;
  undefined1 in_stack_fffffffffffffe17;
  LLVMDependenceGraph *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  CallCompatibility in_stack_fffffffffffffe2c;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_stack_fffffffffffffe30;
  Function *in_stack_fffffffffffffe38;
  function_ref<void(llvm::Value_const*)> local_1c0 [15];
  undefined1 in_stack_fffffffffffffe4f;
  Value *in_stack_fffffffffffffe50;
  LLVMNode *in_stack_fffffffffffffe58;
  LLVMDependenceGraph *in_stack_fffffffffffffe60;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  local_160;
  undefined1 *local_158;
  undefined1 local_150 [40];
  undefined1 local_128 [16];
  LLVMDependenceGraph *local_118;
  _Base_ptr local_110;
  undefined1 local_108;
  undefined1 local_f0 [16];
  LLVMDependenceGraph *local_e0;
  LLVMDependenceGraph *local_d8;
  reference local_d0;
  Function **local_c8;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [40];
  undefined1 local_88 [16];
  ret_type local_78;
  undefined1 local_70 [16];
  undefined1 *local_60;
  LLVMPointsToSetImpl *local_58;
  LLVMPointsToSetImpl *local_50;
  undefined1 *local_48;
  undefined1 local_40 [8];
  ret_type local_38;
  Value *local_30;
  ret_type local_28;
  long local_20;
  
  local_20 = in_RCX;
  local_28 = llvm::dyn_cast<llvm::CallInst,llvm::Value>((Value *)in_stack_fffffffffffffe00);
  if (local_28 == (ret_type)0x0) {
    bVar5 = llvm::isa<llvm::UnreachableInst,llvm::Value*>((Value **)0x17dafd);
    if (bVar5) {
      getOrCreateNoReturn((LLVMDependenceGraph *)in_stack_fffffffffffffe30);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (local_20 != 0) {
        Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
    }
    else {
      pIVar6 = llvm::dyn_cast<llvm::Instruction,llvm::Value>((Value *)in_stack_fffffffffffffe00);
      i = (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (pIVar6 != (ret_type)0x0) {
        bVar5 = llvm::isa<llvm::LoadInst,llvm::Value*>((Value **)0x17db80);
        if ((bVar5) ||
           (bVar5 = llvm::isa<llvm::GetElementPtrInst,llvm::Value*>((Value **)0x17db91), bVar5)) {
          pVVar7 = llvm::User::getOperand((User *)in_stack_fffffffffffffe00,i);
          llvm::function_ref<void(llvm::Value_const*)>::
          function_ref<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                    ((function_ref<void(llvm::Value_const*)> *)&stack0xfffffffffffffe60,
                     (anon_class_1_0_00000001 *)&stack0xfffffffffffffe5f,
                     (enable_if_t<_std::is_same<remove_cvref_t<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>,_function_ref<void_(const_Value_*)>_>::value>
                      *)0x0,(enable_if_t<std::is_void<void>::value____std::is_convertible<decltype(std::declval<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>()(std::declval<const_Value_*>())),_void>::value>
                             *)0x0);
          Func.callable._0_5_ = in_stack_fffffffffffffe10;
          Func.callback = (_func_void_intptr_t_Value_ptr *)pVVar7;
          Func.callable._5_1_ = in_stack_fffffffffffffe15;
          Func.callable._6_1_ = in_stack_fffffffffffffe16;
          Func.callable._7_1_ = in_stack_fffffffffffffe17;
          llvm::Value::stripInBoundsOffsets((Value *)in_stack_fffffffffffffe00,Func);
          bVar5 = llvm::isa<llvm::GlobalVariable,llvm::Value*>((Value **)0x17dbe4);
          if (bVar5) {
            addFormalGlobal((LLVMDependenceGraph *)in_stack_fffffffffffffe58,
                            in_stack_fffffffffffffe50);
          }
        }
        else {
          bVar5 = llvm::isa<llvm::StoreInst,llvm::Value*>((Value **)0x17dc0b);
          if (bVar5) {
            pVVar7 = llvm::User::getOperand((User *)in_stack_fffffffffffffe00,i);
            llvm::function_ref<void(llvm::Value_const*)>::
            function_ref<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                      (local_1c0,(anon_class_1_0_00000001 *)&stack0xfffffffffffffe3f,
                       (enable_if_t<_std::is_same<remove_cvref_t<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>,_function_ref<void_(const_Value_*)>_>::value>
                        *)0x0,(enable_if_t<std::is_void<void>::value____std::is_convertible<decltype(std::declval<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>()(std::declval<const_Value_*>())),_void>::value>
                               *)0x0);
            Func_00.callable._0_5_ = in_stack_fffffffffffffe10;
            Func_00.callback = (_func_void_intptr_t_Value_ptr *)in_stack_fffffffffffffe08;
            Func_00.callable._5_1_ = in_stack_fffffffffffffe15;
            Func_00.callable._6_1_ = in_stack_fffffffffffffe16;
            Func_00.callable._7_1_ = in_stack_fffffffffffffe17;
            val_00 = llvm::Value::stripInBoundsOffsets(pVVar7,Func_00);
            bVar5 = llvm::isa<llvm::GlobalVariable,llvm::Value*>((Value **)0x17dc61);
            if (bVar5) {
              addFormalGlobal((LLVMDependenceGraph *)in_stack_fffffffffffffe58,val_00);
            }
            llvm::User::getOperand((User *)pVVar7,i);
            llvm::function_ref<void(llvm::Value_const*)>::
            function_ref<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                      ((function_ref<void(llvm::Value_const*)> *)&stack0xfffffffffffffe28,
                       (anon_class_1_0_00000001 *)&stack0xfffffffffffffe27,
                       (enable_if_t<_std::is_same<remove_cvref_t<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>,_function_ref<void_(const_Value_*)>_>::value>
                        *)0x0,(enable_if_t<std::is_void<void>::value____std::is_convertible<decltype(std::declval<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>()(std::declval<const_Value_*>())),_void>::value>
                               *)0x0);
            Func_01.callable._0_5_ = in_stack_fffffffffffffe10;
            Func_01.callback = (_func_void_intptr_t_Value_ptr *)in_stack_fffffffffffffe08;
            Func_01.callable._5_1_ = in_stack_fffffffffffffe15;
            Func_01.callable._6_1_ = in_stack_fffffffffffffe16;
            Func_01.callable._7_1_ = in_stack_fffffffffffffe17;
            pVVar7 = llvm::Value::stripInBoundsOffsets(pVVar7,Func_01);
            bVar5 = llvm::isa<llvm::GlobalVariable,llvm::Value*>((Value **)0x17dcc4);
            if (bVar5) {
              addFormalGlobal((LLVMDependenceGraph *)in_stack_fffffffffffffe58,pVVar7);
            }
          }
        }
      }
    }
  }
  else {
    llvm::CallBase::getCalledOperand((CallBase *)0x17d4b5);
    local_30 = llvm::Value::stripPointerCasts((Value *)0x17d4bd);
    local_38 = llvm::dyn_cast<llvm::Function,llvm::Value>((Value *)in_stack_fffffffffffffe00);
    if (local_38 == (ret_type)0x0) {
      bVar5 = llvm::CallBase::isInlineAsm((CallBase *)in_stack_fffffffffffffe00);
      auVar4._8_8_ = local_70._8_8_;
      auVar4._0_8_ = local_70._0_8_;
      auVar8._8_8_ = local_88._8_8_;
      auVar8._0_8_ = local_88._0_8_;
      if ((!bVar5) &&
         (local_88 = auVar8, local_70 = auVar4,
         *(_Base_ptr *)
          ((long)&(in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                  userEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                  super__Rb_tree_header + 0x10) != (_Base_ptr)0x0)) {
        p_Var1 = *(_Base_ptr *)
                  ((long)&(in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>)
                          .userEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                          super__Rb_tree_header + 0x10);
        (**(code **)(*(long *)&p_Var1->_M_color + 8))(local_40,p_Var1,local_30);
        bVar5 = LLVMPointsToSet::empty((LLVMPointsToSet *)0x17d540);
        if (bVar5) {
          llvmutils::printerr((char *)CONCAT17(in_stack_fffffffffffffe17,
                                               CONCAT16(in_stack_fffffffffffffe16,
                                                        CONCAT15(in_stack_fffffffffffffe15,
                                                                 in_stack_fffffffffffffe10))),
                              (Value *)in_stack_fffffffffffffe08,
                              SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0));
        }
        local_48 = local_40;
        local_50 = (LLVMPointsToSetImpl *)
                   LLVMPointsToSet::begin((LLVMPointsToSet *)in_stack_fffffffffffffdf8);
        local_58 = (LLVMPointsToSetImpl *)LLVMPointsToSet::end();
        while( true ) {
          bVar5 = LLVMPointsToSet::const_iterator::operator!=
                            ((const_iterator *)in_stack_fffffffffffffe00,
                             (const_iterator *)in_stack_fffffffffffffdf8);
          if (!bVar5) break;
          auVar8 = LLVMPointsToSet::const_iterator::operator*((const_iterator *)0x17d5bc);
          local_60 = local_70;
          local_70 = auVar8;
          local_78 = llvm::dyn_cast<llvm::Function,llvm::Value>((Value *)in_stack_fffffffffffffe00);
          if (local_78 != (ret_type)0x0) {
            bVar5 = llvm::Function::empty((Function *)0x17d611);
            if (!bVar5) {
              bVar5 = llvmutils::callIsCompatible
                                (in_stack_fffffffffffffe38,(CallInst *)in_stack_fffffffffffffe30,
                                 in_stack_fffffffffffffe2c);
              if (bVar5) {
                local_e0 = buildSubgraph(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                                         (Function *)in_stack_fffffffffffffe50,
                                         (bool)in_stack_fffffffffffffe4f);
                Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                          (in_stack_fffffffffffffe30,
                           (LLVMDependenceGraph *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                goto LAB_0017d810;
              }
            }
            in_stack_fffffffffffffe17 = false;
            if ((((in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                  revDataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_color & _S_black) != _S_red) &&
               (in_stack_fffffffffffffe17 = false, local_78 != (ret_type)0x0)) {
              auVar8 = llvm::Value::getName();
              local_88 = auVar8;
              llvm::StringRef::StringRef
                        ((StringRef *)
                         CONCAT17(in_stack_fffffffffffffe17,
                                  CONCAT16(in_stack_fffffffffffffe16,
                                           CONCAT15(in_stack_fffffffffffffe15,
                                                    in_stack_fffffffffffffe10))),
                         (char *)in_stack_fffffffffffffe08);
              LHS.Length = (size_t)in_stack_fffffffffffffe20;
              LHS.Data = (char *)in_RDI;
              RHS.Length._0_5_ = in_stack_fffffffffffffe10;
              RHS.Data = (char *)in_stack_fffffffffffffe08;
              RHS.Length._5_1_ = in_stack_fffffffffffffe15;
              RHS.Length._6_1_ = in_stack_fffffffffffffe16;
              RHS.Length._7_1_ = in_stack_fffffffffffffe17;
              in_stack_fffffffffffffe17 = llvm::operator==(LHS,RHS);
            }
            if ((bool)in_stack_fffffffffffffe17 != false) {
              llvm::CallBase::getArgOperand
                        ((CallBase *)in_stack_fffffffffffffe00,
                         (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
              getCalledFunctions((Value *)in_stack_fffffffffffffe58,
                                 (LLVMPointerAnalysis *)in_stack_fffffffffffffe50);
              local_b8 = local_b0;
              local_c0._M_current =
                   (Function **)
                   std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
                   begin((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                         in_stack_fffffffffffffdf8);
              local_c8 = (Function **)
                         std::
                         vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
                         end((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              *)in_stack_fffffffffffffdf8);
              while( true ) {
                bVar5 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                                    *)in_stack_fffffffffffffe00,
                                   (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                                    *)in_stack_fffffffffffffdf8);
                if (!bVar5) break;
                local_d0 = __gnu_cxx::
                           __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                           ::operator*(&local_c0);
                bVar5 = llvm::Function::empty((Function *)0x17d76b);
                if (!bVar5) {
                  local_d8 = buildSubgraph(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                                           (Function *)in_stack_fffffffffffffe50,
                                           (bool)in_stack_fffffffffffffe4f);
                  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                            (in_stack_fffffffffffffe30,
                             (LLVMDependenceGraph *)
                             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
                }
                __gnu_cxx::
                __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                ::operator++(&local_c0);
              }
              std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
                        ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                         CONCAT17(in_stack_fffffffffffffe17,
                                  CONCAT16(in_stack_fffffffffffffe16,
                                           CONCAT15(in_stack_fffffffffffffe15,
                                                    in_stack_fffffffffffffe10))));
            }
          }
LAB_0017d810:
          LLVMPointsToSet::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe00);
        }
        LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x17d82f);
      }
    }
    auVar2._8_8_ = local_f0._8_8_;
    auVar2._0_8_ = local_f0._0_8_;
    uVar11 = false;
    if ((local_38 != (ret_type)0x0) &&
       (uVar11 = false, local_f0 = auVar2,
       *(long *)&(in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                 revDataDepEdges.super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl != 0))
    {
      local_f0 = llvm::Value::getName();
      llvm::StringRef::StringRef
                ((StringRef *)
                 CONCAT17(in_stack_fffffffffffffe17,
                          CONCAT16(uVar11,CONCAT15(in_stack_fffffffffffffe15,
                                                   in_stack_fffffffffffffe10))),
                 (char *)in_stack_fffffffffffffe08);
      RHS_00.Length._0_5_ = in_stack_fffffffffffffe10;
      RHS_00.Data = (char *)in_stack_fffffffffffffe08;
      RHS_00.Length._5_1_ = in_stack_fffffffffffffe15;
      RHS_00.Length._6_1_ = uVar11;
      RHS_00.Length._7_1_ = in_stack_fffffffffffffe17;
      uVar11 = llvm::StringRef::equals((StringRef *)in_stack_fffffffffffffe00,RHS_00);
    }
    if ((bool)uVar11 != false) {
      pVar9 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
              insert((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                      *)in_stack_fffffffffffffe20,(value_type *)in_RDI);
      local_110 = (_Base_ptr)pVar9.first._M_node;
      local_108 = pVar9.second;
    }
    bVar5 = is_func_defined((Function *)in_stack_fffffffffffffe00);
    if (bVar5) {
      local_118 = buildSubgraph(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                                (Function *)in_stack_fffffffffffffe50,
                                (bool)in_stack_fffffffffffffe4f);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                (in_stack_fffffffffffffe30,
                 (LLVMDependenceGraph *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    llvm::CallBase::getCalledFunction(in_stack_fffffffffffffe08);
    bVar5 = isMemAllocationFunc((Function *)in_stack_fffffffffffffe58);
    if (bVar5) {
      addFormalParameter((LLVMDependenceGraph *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50)
      ;
    }
    auVar3._8_8_ = local_128._8_8_;
    auVar3._0_8_ = local_128._0_8_;
    uVar10 = false;
    if ((((in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).revDataDepEdges
          .super_DGContainer<dg::LLVMNode_*,_4U>.container._M_t._M_impl.super__Rb_tree_header.
          _M_header._M_color & _S_black) != _S_red) &&
       (uVar10 = false, local_128 = auVar3, local_38 != (ret_type)0x0)) {
      local_128 = llvm::Value::getName();
      llvm::StringRef::StringRef
                ((StringRef *)
                 CONCAT17(in_stack_fffffffffffffe17,
                          CONCAT16(uVar11,CONCAT15(uVar10,in_stack_fffffffffffffe10))),
                 (char *)in_stack_fffffffffffffe08);
      LHS_00.Length = (size_t)in_stack_fffffffffffffe20;
      LHS_00.Data = (char *)in_RDI;
      RHS_01.Length._0_5_ = in_stack_fffffffffffffe10;
      RHS_01.Data = (char *)in_stack_fffffffffffffe08;
      RHS_01.Length._5_1_ = uVar10;
      RHS_01.Length._6_1_ = uVar11;
      RHS_01.Length._7_1_ = in_stack_fffffffffffffe17;
      uVar10 = llvm::operator==(LHS_00,RHS_01);
    }
    if ((bool)uVar10 != false) {
      llvm::CallBase::getArgOperand
                ((CallBase *)in_stack_fffffffffffffe00,
                 (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
      getCalledFunctions((Value *)in_stack_fffffffffffffe58,
                         (LLVMPointerAnalysis *)in_stack_fffffffffffffe50);
      local_158 = local_150;
      local_160._M_current =
           (Function **)
           std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                     ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                      in_stack_fffffffffffffdf8);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                 in_stack_fffffffffffffdf8);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                            *)in_stack_fffffffffffffe00,
                           (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                            *)in_stack_fffffffffffffdf8);
        if (!bVar5) break;
        __gnu_cxx::
        __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
        ::operator*(&local_160);
        buildSubgraph(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                      (Function *)in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f);
        Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                  (in_stack_fffffffffffffe30,
                   (LLVMDependenceGraph *)
                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        __gnu_cxx::
        __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
        ::operator++(&local_160);
      }
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::~vector
                ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                 CONCAT17(in_stack_fffffffffffffe17,
                          CONCAT16(uVar11,CONCAT15(uVar10,in_stack_fffffffffffffe10))));
    }
    addCallNode(in_stack_fffffffffffffe20,in_RDI);
  }
  return;
}

Assistant:

void LLVMDependenceGraph::handleInstruction(llvm::Value *val, LLVMNode *node,
                                            LLVMNode *prevNode) {
    using namespace llvm;

    if (CallInst *CInst = dyn_cast<CallInst>(val)) {
#if LLVM_VERSION_MAJOR >= 8
        Value *strippedValue = CInst->getCalledOperand()->stripPointerCasts();
#else
        Value *strippedValue = CInst->getCalledValue()->stripPointerCasts();
#endif
        Function *func = dyn_cast<Function>(strippedValue);
        // if func is nullptr, then this is indirect call
        // via function pointer. If we have the points-to information,
        // create the subgraph
        if (!func && !CInst->isInlineAsm() && PTA) {
            using namespace dg::pta;
            auto pts = PTA->getLLVMPointsTo(strippedValue);
            if (pts.empty()) {
                llvmutils::printerr("Had no PTA node", strippedValue);
            }
            for (const LLVMPointer &ptr : pts) {
                // vararg may introduce imprecision here, so we
                // must check that it is really pointer to a function
                Function *F = dyn_cast<Function>(ptr.value);
                if (!F)
                    continue;

                if (F->empty() || !llvmutils::callIsCompatible(F, CInst)) {
                    if (threads && F && F->getName() == "pthread_create") {
                        auto possibleFunctions = getCalledFunctions(
                                CInst->getArgOperand(2), PTA);
                        for (auto &function : possibleFunctions) {
                            if (!function->empty()) {
                                LLVMDependenceGraph *subg = buildSubgraph(
                                        node,
                                        const_cast<llvm::Function *>(function),
                                        true /*this is fork*/);
                                node->addSubgraph(subg);
                            }
                        }
                    } else {
                        // incompatible prototypes or the function
                        // is only declaration
                        continue;
                    }
                } else {
                    LLVMDependenceGraph *subg = buildSubgraph(node, F);
                    node->addSubgraph(subg);
                }
            }
        }

        if (func && gather_callsites &&
            func->getName().equals(gather_callsites)) {
            gatheredCallsites->insert(node);
        }

        if (is_func_defined(func)) {
            LLVMDependenceGraph *subg = buildSubgraph(node, func);
            node->addSubgraph(subg);
        }

        // if we allocate a memory in a function, we can pass
        // it to other functions, so it is like global.
        // We need it as parameter, so that if we define it,
        // we can add def-use edges from parent, through the parameter
        // to the definition
        if (isMemAllocationFunc(CInst->getCalledFunction()))
            addFormalParameter(val);

        if (threads && func && func->getName() == "pthread_create") {
            auto possibleFunctions =
                    getCalledFunctions(CInst->getArgOperand(2), PTA);
            for (auto &function : possibleFunctions) {
                auto *subg = buildSubgraph(
                        node, const_cast<llvm::Function *>(function),
                        true /*this is fork*/);
                node->addSubgraph(subg);
            }
        }

        // no matter what is the function, this is a CallInst,
        // so create call-graph
        addCallNode(node);
    } else if (isa<UnreachableInst>(val)) {
        auto *noret = getOrCreateNoReturn();
        node->addControlDependence(noret);
        // unreachable is being inserted because of the previous instr
        // aborts the program. This means that whether it is executed
        // depends on the previous instr
        if (prevNode)
            prevNode->addControlDependence(noret);
    } else if (Instruction *Inst = dyn_cast<Instruction>(val)) {
        if (isa<LoadInst>(val) || isa<GetElementPtrInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        } else if (isa<StoreInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);

            op = Inst->getOperand(1)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        }
    }
}